

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O2

int SUNLinSolSetup_Dense(SUNLinearSolver S,SUNMatrix A)

{
  sunindextype *p;
  SUNMatrix_ID SVar1;
  sunindextype sVar2;
  sunindextype n;
  int iVar3;
  realtype **a;
  
  iVar3 = -0x321;
  if (S != (SUNLinearSolver)0x0 && A != (SUNMatrix)0x0) {
    SVar1 = SUNMatGetID(A);
    if (SVar1 == SUNMATRIX_DENSE) {
      a = SUNDenseMatrix_Cols(A);
      p = *(sunindextype **)((long)S->content + 8);
      if (p == (sunindextype *)0x0 || a == (realtype **)0x0) {
        *(undefined4 *)((long)S->content + 0x10) = 0xfffffcdd;
        iVar3 = -0x323;
      }
      else {
        sVar2 = SUNDenseMatrix_Rows(A);
        n = SUNDenseMatrix_Columns(A);
        sVar2 = SUNDlsMat_denseGETRF(a,sVar2,n,p);
        *(sunindextype *)((long)S->content + 0x10) = sVar2;
        iVar3 = 0x328;
        if (sVar2 < 1) {
          iVar3 = 0;
        }
      }
    }
    else {
      *(undefined4 *)((long)S->content + 0x10) = 0xfffffcde;
      iVar3 = -0x322;
    }
  }
  return iVar3;
}

Assistant:

int SUNLinSolSetup_Dense(SUNLinearSolver S, SUNMatrix A)
{
  realtype **A_cols;
  sunindextype *pivots;

  /* check for valid inputs */
  if ( (A == NULL) || (S == NULL) )
    return(SUNLS_MEM_NULL);

  /* Ensure that A is a dense matrix */
  if (SUNMatGetID(A) != SUNMATRIX_DENSE) {
    LASTFLAG(S) = SUNLS_ILL_INPUT;
    return(SUNLS_ILL_INPUT);
  }

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  pivots = NULL;
  A_cols = SUNDenseMatrix_Cols(A);
  pivots = PIVOTS(S);
  if ( (A_cols == NULL) || (pivots == NULL) ) {
    LASTFLAG(S) = SUNLS_MEM_FAIL;
    return(SUNLS_MEM_FAIL);
  }

  /* perform LU factorization of input matrix */
  LASTFLAG(S) = SUNDlsMat_denseGETRF(A_cols, SUNDenseMatrix_Rows(A),
                                     SUNDenseMatrix_Columns(A), pivots);

  /* store error flag (if nonzero, this row encountered zero-valued pivod) */
  if (LASTFLAG(S) > 0)
    return(SUNLS_LUFACT_FAIL);
  return(SUNLS_SUCCESS);
}